

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

int recff_bit64_nary(jit_State *J,RecordFFData *rd)

{
  TRef *pTVar1;
  uint32_t uVar2;
  IRRef1 IVar3;
  CTypeID CVar4;
  TRef TVar6;
  TRef *pTVar7;
  CType *d;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  CTState *cts;
  uint k;
  TRef TVar5;
  
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pTVar7 = J->base;
  iVar9 = 0;
  k = 0;
  if (*pTVar7 != 0) {
    k = 0;
    uVar8 = 0;
    uVar10 = 1;
    do {
      CVar4 = crec_bit64_type(cts,rd->argv + uVar8);
      if (k <= CVar4) {
        k = CVar4;
      }
      pTVar7 = J->base;
      pTVar1 = pTVar7 + uVar10;
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (*pTVar1 != 0);
  }
  if (k != 0) {
    d = cts->tab + k;
    uVar2 = rd->data;
    TVar5 = crec_bit64_arg(J,d,*pTVar7,rd->argv);
    IVar3 = (IRRef1)TVar5;
    TVar6 = J->base[1];
    if (TVar6 != 0) {
      uVar8 = 1;
      uVar10 = 2;
      do {
        TVar6 = crec_bit64_arg(J,d,TVar6,rd->argv + uVar8);
        (J->fold).ins.field_0.ot = (short)k + 10U | (ushort)(uVar2 << 8);
        (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar5 = lj_opt_fold(J);
        IVar3 = (IRRef1)TVar5;
        TVar6 = J->base[uVar10];
        uVar8 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (TVar6 != 0);
    }
    TVar6 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x528a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = IVar3;
    TVar6 = lj_opt_fold(J);
    *J->base = TVar6;
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int LJ_FASTCALL recff_bit64_nary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = 0;
  MSize i;
  for (i = 0; J->base[i] != 0; i++) {
    CTypeID aid = crec_bit64_type(cts, &rd->argv[i]);
    if (id < aid) id = aid;  /* Determine highest type rank of all arguments. */
  }
  if (id) {
    CType *ct = ctype_get(cts, id);
    uint32_t ot = IRT(rd->data, id-CTID_INT64+IRT_I64);
    TRef tr = crec_bit64_arg(J, ct, J->base[0], &rd->argv[0]);
    for (i = 1; J->base[i] != 0; i++) {
      TRef tr2 = crec_bit64_arg(J, ct, J->base[i], &rd->argv[i]);
      tr = emitir(ot, tr, tr2);
    }
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}